

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O3

ostream * eglu::operator<<(ostream *str,SurfaceAttribValueFmt *attribFmt)

{
  deUint32 dVar1;
  ostream *poVar2;
  Enum<int,_2UL> local_10;
  
  dVar1 = attribFmt->attribute;
  if ((int)dVar1 < 0x3080) {
    if ((dVar1 - 0x3056 < 2) || (dVar1 == 0x3028)) goto switchD_00e976c1_caseD_3090;
    if (dVar1 != 0x3058) goto switchD_00e976c1_caseD_3083;
switchD_00e976c1_caseD_3082:
    local_10.m_value = attribFmt->value;
    local_10.m_getName = getBoolDontCareName;
  }
  else {
    switch(dVar1) {
    case 0x3080:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getTextureFormatName;
      break;
    case 0x3081:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getTextureTargetName;
      break;
    case 0x3082:
      goto switchD_00e976c1_caseD_3082;
    default:
switchD_00e976c1_caseD_3083:
      local_10.m_getName = (GetNameFunc)(ulong)(uint)attribFmt->value;
      poVar2 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_10,str);
      return poVar2;
    case 0x3086:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getRenderBufferName;
      break;
    case 0x3087:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getColorspaceName;
      break;
    case 0x3088:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getAlphaFormatName;
      break;
    case 0x3090:
    case 0x3091:
    case 0x3092:
switchD_00e976c1_caseD_3090:
      poVar2 = (ostream *)std::ostream::operator<<(str,attribFmt->value);
      return poVar2;
    case 0x3093:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getSwapBehaviorName;
      break;
    case 0x3099:
      local_10.m_value = attribFmt->value;
      local_10.m_getName = getMultisampleResolveName;
    }
  }
  poVar2 = tcu::Format::Enum<int,_2UL>::toStream(&local_10,str);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const SurfaceAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_CONFIG_ID:
		case EGL_WIDTH:
		case EGL_HEIGHT:
		case EGL_HORIZONTAL_RESOLUTION:
		case EGL_VERTICAL_RESOLUTION:
		case EGL_PIXEL_ASPECT_RATIO:
			return str << (int)attribFmt.value;

		case EGL_LARGEST_PBUFFER:
		case EGL_MIPMAP_TEXTURE:
			return str << getBoolDontCareStr(attribFmt.value);

		case EGL_MULTISAMPLE_RESOLVE:
			return str << getMultisampleResolveStr(attribFmt.value);

		case EGL_RENDER_BUFFER:
			return str << getRenderBufferStr(attribFmt.value);

		case EGL_SWAP_BEHAVIOR:
			return str << getSwapBehaviorStr(attribFmt.value);

		case EGL_TEXTURE_FORMAT:
			return str << getTextureFormatStr(attribFmt.value);

		case EGL_TEXTURE_TARGET:
			return str << getTextureTargetStr(attribFmt.value);

		case EGL_ALPHA_FORMAT:
			return str << getAlphaFormatStr(attribFmt.value);

		case EGL_COLORSPACE:
			return str << getColorspaceStr(attribFmt.value);

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}